

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O2

Status __thiscall
leveldb::Table::Open
          (Table *this,Options *options,RandomAccessFile *file,uint64_t size,Table **table)

{
  Block *this_00;
  Rep *pRVar1;
  uint64_t uVar2;
  Table *this_01;
  BlockContents index_block_contents;
  ReadOptions opt;
  Footer footer;
  Rep *local_80;
  Slice footer_input;
  char footer_space [48];
  
  *table = (Table *)0x0;
  if (size < 0x30) {
    footer_space._0_8_ = anon_var_dwarf_24969;
    footer_space[8] = '\"';
    footer_space[9] = '\0';
    footer_space[10] = '\0';
    footer_space[0xb] = '\0';
    footer_space[0xc] = '\0';
    footer_space[0xd] = '\0';
    footer_space[0xe] = '\0';
    footer_space[0xf] = '\0';
    footer.metaindex_handle_.offset_ = (long)"\'\n" + 2;
    footer.metaindex_handle_.size_ = 0;
    Status::Corruption((Status *)this,(Slice *)footer_space,(Slice *)&footer);
  }
  else {
    footer_input.data_ = "";
    footer_input.size_ = 0;
    (*file->_vptr_RandomAccessFile[2])(this,file,size - 0x30,0x30,&footer_input,footer_space);
    if (this->rep_ == (Rep *)0x0) {
      footer.index_handle_.offset_._0_4_ = 0xffffffff;
      footer.index_handle_.offset_._4_4_ = 0xffffffff;
      footer.index_handle_.size_._0_4_ = 0xffffffff;
      footer.index_handle_.size_._4_4_ = 0xffffffff;
      footer.metaindex_handle_.offset_ = 0xffffffffffffffff;
      footer.metaindex_handle_.size_ = 0xffffffffffffffff;
      Footer::DecodeFrom((Footer *)&index_block_contents,(Slice *)&footer);
      pRVar1 = this->rep_;
      this->rep_ = (Rep *)index_block_contents.data.data_;
      index_block_contents.data.data_ = (char *)pRVar1;
      Status::~Status((Status *)&index_block_contents);
      if (this->rep_ == (Rep *)0x0) {
        index_block_contents.data.data_ = "";
        index_block_contents.data.size_ = 0;
        opt.verify_checksums = false;
        opt.fill_cache = true;
        opt.snapshot = (Snapshot *)0x0;
        opt.decompress_allocator = (DecompressAllocator *)0x0;
        if (options->paranoid_checks == true) {
          opt.verify_checksums = true;
          opt.fill_cache = true;
        }
        ReadBlock((leveldb *)&local_80,file,options,&opt,&footer.index_handle_,&index_block_contents
                 );
        pRVar1 = this->rep_;
        this->rep_ = local_80;
        local_80 = pRVar1;
        Status::~Status((Status *)&local_80);
        if (this->rep_ == (Rep *)0x0) {
          this_00 = (Block *)operator_new(0x18);
          Block::Block(this_00,&index_block_contents);
          pRVar1 = (Rep *)operator_new(0x8a0);
          Rep::Rep(pRVar1);
          memcpy(pRVar1,options,0x860);
          pRVar1->file = file;
          (pRVar1->metaindex_handle).offset_ = footer.metaindex_handle_.offset_;
          (pRVar1->metaindex_handle).size_ = footer.metaindex_handle_.size_;
          pRVar1->index_block = this_00;
          if (options->block_cache == (Cache *)0x0) {
            uVar2 = 0;
          }
          else {
            uVar2 = (**(code **)(*(long *)options->block_cache + 0x38))();
          }
          pRVar1->cache_id = uVar2;
          pRVar1->filter = (FilterBlockReader *)0x0;
          pRVar1->filter_data = (char *)0x0;
          this_01 = (Table *)operator_new(8);
          this_01->rep_ = pRVar1;
          *table = this_01;
          ReadMeta(this_01,&footer);
        }
      }
    }
  }
  return (Status)(char *)this;
}

Assistant:

Status Table::Open(const Options& options, RandomAccessFile* file,
                   uint64_t size, Table** table) {
  *table = nullptr;
  if (size < Footer::kEncodedLength) {
    return Status::Corruption("file is too short to be an sstable");
  }

  char footer_space[Footer::kEncodedLength];
  Slice footer_input;
  Status s = file->Read(size - Footer::kEncodedLength, Footer::kEncodedLength,
                        &footer_input, footer_space);
  if (!s.ok()) return s;

  Footer footer;
  s = footer.DecodeFrom(&footer_input);
  if (!s.ok()) return s;

  // Read the index block
  BlockContents index_block_contents;
  if (s.ok()) {
    ReadOptions opt;
    if (options.paranoid_checks) {
      opt.verify_checksums = true;
    }
    s = ReadBlock(file, options, opt, footer.index_handle(), &index_block_contents);
  }

  if (s.ok()) {
    // We've successfully read the footer and the index block: we're
    // ready to serve requests.
    Block* index_block = new Block(index_block_contents);
    Rep* rep = new Table::Rep;
    rep->options = options;
    rep->file = file;
    rep->metaindex_handle = footer.metaindex_handle();
    rep->index_block = index_block;
    rep->cache_id = (options.block_cache ? options.block_cache->NewId() : 0);
    rep->filter_data = nullptr;
    rep->filter = nullptr;
    *table = new Table(rep);
    (*table)->ReadMeta(footer);
  }

  return s;
}